

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grafmode.c
# Opt level: O0

parser_error parse_graf_size(parser *p)

{
  uint uVar1;
  void *pvVar2;
  char *src;
  graphics_mode *mode;
  parser *p_local;
  
  pvVar2 = parser_priv(p);
  if (pvVar2 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_INVALID_VALUE;
  }
  else {
    uVar1 = parser_getuint(p,"wid");
    *(short *)((long)pvVar2 + 0xc) = (short)uVar1;
    uVar1 = parser_getuint(p,"hgt");
    *(short *)((long)pvVar2 + 0xe) = (short)uVar1;
    src = parser_getstr(p,"filename");
    my_strcpy((char *)((long)pvVar2 + 0x130),src,0x20);
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_graf_size(struct parser *p) {
	graphics_mode *mode = parser_priv(p);
	if (!mode) {
		return PARSE_ERROR_INVALID_VALUE;
	}
	mode->cell_width = parser_getuint(p, "wid");
	mode->cell_height = parser_getuint(p, "hgt");
	my_strcpy(mode->file, parser_getstr(p, "filename"), 32);
	return PARSE_ERROR_NONE;
}